

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O2

any * __thiscall dap::any::operator=(any *this,any *rhs)

{
  TypeInfo *pTVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  reset(this);
  pTVar1 = rhs->type;
  this->type = pTVar1;
  if (rhs->value != (void *)0x0) {
    iVar2 = (*pTVar1->_vptr_TypeInfo[3])();
    iVar3 = (*this->type->_vptr_TypeInfo[4])();
    alloc(this,CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
    (*this->type->_vptr_TypeInfo[6])(this->type,this->value,rhs->value);
  }
  return this;
}

Assistant:

any& any::operator=(const any& rhs) {
  reset();
  type = rhs.type;
  if (rhs.value != nullptr) {
    alloc(type->size(), type->alignment());
    type->copyConstruct(value, rhs.value);
  }
  return *this;
}